

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

OsStackTraceGetterInterface * __thiscall
testing::internal::UnitTestImpl::os_stack_trace_getter(UnitTestImpl *this)

{
  OsStackTraceGetterInterface *pOVar1;
  
  pOVar1 = this->os_stack_trace_getter_;
  if (pOVar1 == (OsStackTraceGetterInterface *)0x0) {
    pOVar1 = (OsStackTraceGetterInterface *)operator_new(0x48);
    pOVar1->_vptr_OsStackTraceGetterInterface = (_func_int **)&PTR__OsStackTraceGetter_00146758;
    Mutex::Mutex((Mutex *)(pOVar1 + 1));
    pOVar1[8]._vptr_OsStackTraceGetterInterface = (_func_int **)0x0;
    this->os_stack_trace_getter_ = pOVar1;
  }
  return pOVar1;
}

Assistant:

OsStackTraceGetterInterface* UnitTestImpl::os_stack_trace_getter() {
  if (os_stack_trace_getter_ == NULL) {
    os_stack_trace_getter_ = new OsStackTraceGetter;
  }

  return os_stack_trace_getter_;
}